

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm1d.c
# Opt level: O1

void av1_iadst4(int32_t *input,int32_t *output,int8_t cos_bit,int8_t *stage_range)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  
  iVar1 = *input;
  iVar2 = input[2];
  iVar3 = input[3];
  if (((input[1] != 0 || iVar1 != 0) || iVar2 != 0) || iVar3 != 0) {
    iVar5 = cos_bit + -10;
    iVar4 = av1_sinpi_arr_data[iVar5][3];
    iVar7 = input[1] * iVar4;
    iVar6 = av1_sinpi_arr_data[iVar5][2] * iVar3 + av1_sinpi_arr_data[iVar5][1] * iVar1 +
            av1_sinpi_arr_data[iVar5][4] * iVar2;
    iVar5 = av1_sinpi_arr_data[iVar5][2] * iVar1 -
            (av1_sinpi_arr_data[iVar5][4] * iVar3 + av1_sinpi_arr_data[iVar5][1] * iVar2);
    lVar8 = 1L << (cos_bit - 1U & 0x3f);
    *output = (int32_t)((iVar6 + iVar7) + lVar8 >> (cos_bit & 0x3fU));
    output[1] = (int32_t)((iVar5 + iVar7) + lVar8 >> (cos_bit & 0x3fU));
    output[2] = (int32_t)(((iVar1 - iVar2) + iVar3) * iVar4 + lVar8 >> (cos_bit & 0x3fU));
    output[3] = (int32_t)(((iVar5 - iVar7) + iVar6) + lVar8 >> (cos_bit & 0x3fU));
    return;
  }
  output[0] = 0;
  output[1] = 0;
  output[2] = 0;
  output[3] = 0;
  return;
}

Assistant:

void av1_iadst4(const int32_t *input, int32_t *output, int8_t cos_bit,
                const int8_t *stage_range) {
  int bit = cos_bit;
  const int32_t *sinpi = sinpi_arr(bit);
  int32_t s0, s1, s2, s3, s4, s5, s6, s7;

  int32_t x0 = input[0];
  int32_t x1 = input[1];
  int32_t x2 = input[2];
  int32_t x3 = input[3];

  if (!(x0 | x1 | x2 | x3)) {
    output[0] = output[1] = output[2] = output[3] = 0;
    return;
  }

  assert(sinpi[1] + sinpi[2] == sinpi[4]);

  // stage 1
  s0 = range_check_value(sinpi[1] * x0, stage_range[1] + bit);
  s1 = range_check_value(sinpi[2] * x0, stage_range[1] + bit);
  s2 = range_check_value(sinpi[3] * x1, stage_range[1] + bit);
  s3 = range_check_value(sinpi[4] * x2, stage_range[1] + bit);
  s4 = range_check_value(sinpi[1] * x2, stage_range[1] + bit);
  s5 = range_check_value(sinpi[2] * x3, stage_range[1] + bit);
  s6 = range_check_value(sinpi[4] * x3, stage_range[1] + bit);

  // stage 2
  // NOTICE: (x0 - x2) here may use one extra bit compared to the
  // opt_range_row/col specified in av1_gen_inv_stage_range()
  s7 = range_check_value((x0 - x2) + x3, stage_range[2]);

  // stage 3
  s0 = range_check_value(s0 + s3, stage_range[3] + bit);
  s1 = range_check_value(s1 - s4, stage_range[3] + bit);
  s3 = range_check_value(s2, stage_range[3] + bit);
  s2 = range_check_value(sinpi[3] * s7, stage_range[3] + bit);

  // stage 4
  s0 = range_check_value(s0 + s5, stage_range[4] + bit);
  s1 = range_check_value(s1 - s6, stage_range[4] + bit);

  // stage 5
  x0 = range_check_value(s0 + s3, stage_range[5] + bit);
  x1 = range_check_value(s1 + s3, stage_range[5] + bit);
  x2 = range_check_value(s2, stage_range[5] + bit);
  x3 = range_check_value(s0 + s1, stage_range[5] + bit);

  // stage 6
  x3 = range_check_value(x3 - s3, stage_range[6] + bit);

  output[0] = round_shift(x0, bit);
  output[1] = round_shift(x1, bit);
  output[2] = round_shift(x2, bit);
  output[3] = round_shift(x3, bit);
}